

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  long lVar1;
  long lVar2;
  uint _c;
  int iVar3;
  int iVar4;
  size_t sVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [14];
  undefined1 auVar33 [14];
  undefined1 auVar34 [14];
  undefined1 auVar35 [14];
  undefined1 auVar36 [14];
  undefined1 auVar37 [14];
  undefined1 auVar38 [14];
  undefined1 auVar39 [14];
  undefined1 auVar40 [14];
  undefined1 auVar41 [14];
  undefined1 auVar42 [14];
  undefined1 auVar43 [14];
  undefined1 auVar44 [14];
  undefined1 auVar45 [14];
  undefined1 auVar46 [14];
  undefined1 auVar47 [14];
  undefined1 auVar48 [14];
  undefined1 auVar49 [14];
  undefined1 auVar50 [14];
  undefined1 auVar51 [14];
  undefined1 auVar52 [14];
  undefined1 auVar53 [14];
  undefined1 auVar54 [14];
  undefined1 auVar55 [14];
  undefined1 auVar56 [14];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [14];
  undefined1 auVar61 [14];
  undefined1 auVar62 [14];
  undefined1 auVar63 [14];
  undefined1 auVar64 [14];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [14];
  undefined1 auVar69 [14];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [14];
  undefined1 auVar74 [14];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined8 uVar81;
  undefined1 auVar82 [12];
  undefined1 auVar83 [14];
  undefined1 auVar84 [12];
  undefined1 auVar85 [14];
  undefined1 auVar86 [12];
  undefined1 auVar87 [14];
  undefined1 auVar88 [12];
  undefined1 auVar89 [14];
  undefined1 auVar90 [14];
  undefined1 auVar91 [14];
  undefined1 auVar92 [14];
  undefined1 auVar93 [14];
  undefined1 auVar94 [14];
  undefined1 auVar95 [14];
  undefined1 auVar96 [14];
  undefined1 auVar97 [14];
  undefined1 auVar98 [14];
  undefined1 auVar99 [14];
  undefined1 auVar100 [14];
  undefined1 auVar101 [14];
  undefined1 auVar102 [12];
  undefined1 auVar103 [14];
  undefined1 auVar104 [14];
  undefined1 auVar105 [14];
  undefined1 auVar106 [14];
  undefined1 auVar107 [14];
  undefined1 auVar108 [14];
  undefined1 auVar109 [14];
  undefined1 auVar110 [14];
  undefined1 auVar111 [14];
  undefined1 auVar112 [12];
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  undefined1 auVar115 [12];
  undefined6 uVar116;
  Option *pOVar117;
  uint uVar118;
  undefined4 *puVar119;
  long lVar120;
  ulong uVar121;
  long lVar122;
  long lVar123;
  int *piVar124;
  void *pvVar125;
  long lVar126;
  void *pvVar127;
  int iVar128;
  uint _h;
  long lVar129;
  void *pvVar130;
  short asVar131 [4];
  uint uVar132;
  ulong uVar133;
  long lVar134;
  int i;
  uint uVar135;
  long lVar136;
  ulong uVar137;
  void *pvVar138;
  long lVar139;
  undefined4 *puVar140;
  long lVar141;
  undefined4 *puVar142;
  void *pvVar143;
  void *pvVar144;
  uint uVar145;
  ulong uVar146;
  ulong uVar147;
  long lVar148;
  void *pvVar149;
  uint uVar150;
  undefined4 *puVar151;
  void *pvVar152;
  int iVar153;
  int iVar154;
  int iVar155;
  int iVar168;
  int iVar169;
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  short sVar170;
  short sVar195;
  short sVar197;
  short sVar199;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  short sVar200;
  ushort uVar217;
  short sVar219;
  short sVar221;
  ushort uVar223;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  short sVar218;
  short sVar220;
  short sVar222;
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar216 [16];
  undefined4 uVar224;
  undefined1 in_XMM4 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar236 [16];
  undefined4 uVar240;
  short sVar251;
  short sVar253;
  uint uVar252;
  undefined1 in_XMM5 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  short sVar268;
  short sVar269;
  undefined1 auVar254 [12];
  undefined1 auVar255 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar270 [12];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar276 [12];
  undefined1 auVar277 [16];
  void *local_3d8;
  long local_3d0;
  long local_3c8;
  void *local_3c0;
  short local_3b0 [4];
  int tiles;
  int nRowBlocks;
  long local_3a0;
  long local_398;
  void *local_390;
  int nColBlocks;
  short d1 [4];
  int aiStack_360 [2];
  size_t local_358;
  int iStack_350;
  undefined4 uStack_34c;
  Allocator *local_348;
  int iStack_340;
  int iStack_33c;
  int local_338;
  int iStack_334;
  int iStack_330;
  undefined4 uStack_32c;
  size_t local_328;
  Option *local_318;
  Mat *local_310;
  short local_308 [4];
  short local_300 [4];
  short local_2f8 [4];
  short local_2f0 [4];
  ulong local_2e8;
  void *local_2e0;
  void *local_2d8;
  void *local_2d0;
  void *local_2c8;
  void *local_2c0;
  void *local_2b8;
  int *local_2b0;
  short d0 [4];
  int local_258;
  Mat local_208;
  Mat local_1b8;
  Mat *local_170;
  ulong local_168;
  long local_160;
  size_t local_158;
  undefined8 local_150;
  undefined8 local_148;
  int local_13c;
  short d2 [4];
  int aiStack_130 [2];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  short d3 [4];
  int aiStack_f0 [2];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  int sum3 [16];
  Option opt_b;
  undefined1 auVar157 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined2 uVar167;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 uVar193;
  undefined1 uVar194;
  undefined1 uVar196;
  short sVar198;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar205 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  short sVar250;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar261 [16];
  undefined1 auVar258 [16];
  undefined1 auVar262 [16];
  short sVar274;
  short sVar275;
  undefined1 auVar278 [16];
  
  _c = bottom_blob->c;
  iVar3 = top_blob->w;
  iVar4 = top_blob->h;
  local_2e8 = (ulong)top_blob->c;
  local_1b8.data = bottom_blob->data;
  local_1b8.refcount = bottom_blob->refcount;
  local_1b8.elemsize = bottom_blob->elemsize;
  local_1b8.elempack = bottom_blob->elempack;
  local_1b8.allocator = bottom_blob->allocator;
  local_1b8.dims = bottom_blob->dims;
  local_1b8.w = bottom_blob->w;
  local_1b8.h = bottom_blob->h;
  local_1b8.d = bottom_blob->d;
  iVar153 = bottom_blob->w;
  iVar155 = bottom_blob->h;
  local_1b8.cstep = bottom_blob->cstep;
  if (local_1b8.refcount != (int *)0x0) {
    LOCK();
    *local_1b8.refcount = *local_1b8.refcount + 1;
    UNLOCK();
    iVar153 = bottom_blob->w;
    iVar155 = bottom_blob->h;
  }
  uVar145 = (iVar3 - (iVar3 + 1 >> 0x1f)) + 1;
  uVar132 = uVar145 & 0xfffffffe;
  local_168 = (ulong)uVar132;
  uVar150 = (iVar4 - (iVar4 + 1 >> 0x1f)) + 1;
  _h = uVar150 & 0xfffffffe;
  iVar128 = uVar132 + 2;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.openmp_blocktime = opt->openmp_blocktime;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_packed = opt->use_int8_packed;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_subgroup_basic = opt->use_subgroup_basic;
  opt_b.use_subgroup_vote = opt->use_subgroup_vote;
  opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_b.use_image_storage = opt->use_image_storage;
  opt_b.use_tensor_storage = opt->use_tensor_storage;
  opt_b.use_weight_fp16_storage = opt->use_weight_fp16_storage;
  auVar172._0_4_ = opt->flush_denormals;
  auVar172[4] = opt->use_local_pool_allocator;
  auVar172[5] = opt->use_reserved_1;
  auVar172[6] = opt->use_reserved_2;
  auVar172[7] = opt->use_reserved_3;
  auVar172[8] = opt->use_reserved_4;
  auVar172[9] = opt->use_reserved_5;
  auVar172[10] = opt->use_reserved_6;
  auVar172[0xb] = opt->use_reserved_7;
  auVar172[0xc] = opt->use_reserved_8;
  auVar172[0xd] = opt->use_reserved_9;
  auVar172[0xe] = opt->use_reserved_10;
  auVar172[0xf] = opt->use_reserved_11;
  opt_b.blob_allocator = opt->workspace_allocator;
  local_318 = opt;
  local_310 = kernel_tm;
  local_1b8.c = _c;
  local_170 = top_blob;
  opt_b._48_16_ = auVar172;
  copy_make_border(bottom_blob,&local_1b8,0,(_h - iVar155) + 2,0,iVar128 - iVar153,0,0.0,&opt_b);
  uVar145 = (int)uVar145 >> 1;
  uVar150 = (int)uVar150 >> 1;
  local_208.cstep = 0;
  local_208.data = (void *)0x0;
  local_208.refcount._0_4_ = 0;
  local_208.refcount._4_4_ = 0;
  local_208.elemsize = 0;
  local_208.elempack = 0;
  local_208.allocator = (Allocator *)0x0;
  local_208.dims = 0;
  local_208.w = 0;
  local_208.h = 0;
  local_208.d = 0;
  local_208.c = 0;
  uVar132 = uVar150 * uVar145;
  Mat::create(&local_208,0x10,uVar132,_c,2,opt->workspace_allocator);
  uVar147 = local_2e8;
  pOVar117 = local_318;
  auVar246 = _DAT_00317390;
  uVar121 = (ulong)_c;
  if (0 < (int)_c) {
    lVar129 = (long)iVar128;
    uVar118 = 1;
    if (1 < (int)uVar145) {
      uVar118 = uVar145;
    }
    uVar133 = 1;
    if (1 < (int)uVar150) {
      uVar133 = (ulong)uVar150;
    }
    uVar137 = 0;
    do {
      if (0 < iVar4) {
        pvVar125 = (void *)(local_208.cstep * local_208.elemsize * uVar137 + (long)local_208.data);
        uVar146 = 0;
        do {
          if (0 < iVar3) {
            puVar151 = (undefined4 *)
                       ((long)local_1b8.data +
                       (long)(iVar128 * 2 * (int)uVar146) +
                       local_1b8.cstep * local_1b8.elemsize * uVar137);
            puVar140 = (undefined4 *)((long)puVar151 + lVar129);
            puVar142 = (undefined4 *)((long)puVar140 + lVar129);
            puVar119 = (undefined4 *)(lVar129 + (long)puVar142);
            uVar135 = 0;
            do {
              auVar156 = _d3;
              uVar224 = *puVar151;
              auVar6[0xd] = 0;
              auVar6._0_13_ = auVar172._0_13_;
              auVar6[0xe] = auVar172[7];
              auVar29[0xc] = auVar172[6];
              auVar29._0_12_ = auVar172._0_12_;
              auVar29._13_2_ = auVar6._13_2_;
              auVar57[0xb] = 0;
              auVar57._0_11_ = auVar172._0_11_;
              auVar57._12_3_ = auVar29._12_3_;
              auVar65[10] = auVar172[5];
              auVar65._0_10_ = auVar172._0_10_;
              auVar65._11_4_ = auVar57._11_4_;
              auVar70[9] = 0;
              auVar70._0_9_ = auVar172._0_9_;
              auVar70._10_5_ = auVar65._10_5_;
              auVar75[8] = auVar172[4];
              auVar75._0_8_ = auVar172._0_8_;
              auVar75._9_6_ = auVar70._9_6_;
              auVar201._8_7_ = auVar75._8_7_;
              auVar201[7] = (char)((uint)uVar224 >> 0x18);
              auVar201[6] = auVar172[3];
              auVar201[5] = (char)((uint)uVar224 >> 0x10);
              auVar201[4] = auVar172[2];
              auVar201[3] = (char)((uint)uVar224 >> 8);
              auVar201[2] = auVar172[1];
              auVar201[0] = auVar172[0];
              auVar201[1] = (char)uVar224;
              auVar201[0xf] = 0;
              auVar202 = psraw(auVar201,8);
              uVar224 = *puVar140;
              auVar7[0xd] = 0;
              auVar7._0_13_ = in_XMM4._0_13_;
              auVar7[0xe] = in_XMM4[7];
              auVar30[0xc] = in_XMM4[6];
              auVar30._0_12_ = in_XMM4._0_12_;
              auVar30._13_2_ = auVar7._13_2_;
              auVar58[0xb] = 0;
              auVar58._0_11_ = in_XMM4._0_11_;
              auVar58._12_3_ = auVar30._12_3_;
              auVar66[10] = in_XMM4[5];
              auVar66._0_10_ = in_XMM4._0_10_;
              auVar66._11_4_ = auVar58._11_4_;
              auVar71[9] = 0;
              auVar71._0_9_ = in_XMM4._0_9_;
              auVar71._10_5_ = auVar66._10_5_;
              auVar76[8] = in_XMM4[4];
              auVar76._0_8_ = in_XMM4._0_8_;
              auVar76._9_6_ = auVar71._9_6_;
              auVar225._8_7_ = auVar76._8_7_;
              auVar225[7] = (char)((uint)uVar224 >> 0x18);
              auVar225[6] = in_XMM4[3];
              auVar225[5] = (char)((uint)uVar224 >> 0x10);
              auVar225[4] = in_XMM4[2];
              auVar225[3] = (char)((uint)uVar224 >> 8);
              auVar225[2] = in_XMM4[1];
              auVar225[0] = in_XMM4[0];
              auVar225[1] = (char)uVar224;
              auVar225[0xf] = 0;
              auVar226 = psraw(auVar225,8);
              uVar224 = *puVar142;
              auVar8[0xd] = 0;
              auVar8._0_13_ = in_XMM5._0_13_;
              auVar8[0xe] = in_XMM5[7];
              auVar31[0xc] = in_XMM5[6];
              auVar31._0_12_ = in_XMM5._0_12_;
              auVar31._13_2_ = auVar8._13_2_;
              auVar59[0xb] = 0;
              auVar59._0_11_ = in_XMM5._0_11_;
              auVar59._12_3_ = auVar31._12_3_;
              auVar67[10] = in_XMM5[5];
              auVar67._0_10_ = in_XMM5._0_10_;
              auVar67._11_4_ = auVar59._11_4_;
              auVar72[9] = 0;
              auVar72._0_9_ = in_XMM5._0_9_;
              auVar72._10_5_ = auVar67._10_5_;
              auVar77[8] = in_XMM5[4];
              auVar77._0_8_ = in_XMM5._0_8_;
              auVar77._9_6_ = auVar72._9_6_;
              auVar241._8_7_ = auVar77._8_7_;
              auVar241[7] = (char)((uint)uVar224 >> 0x18);
              auVar241[6] = in_XMM5[3];
              auVar241[5] = (char)((uint)uVar224 >> 0x10);
              auVar241[4] = in_XMM5[2];
              auVar241[3] = (char)((uint)uVar224 >> 8);
              auVar241[2] = in_XMM5[1];
              auVar241[0] = in_XMM5[0];
              auVar241[1] = (char)uVar224;
              auVar241[0xf] = 0;
              auVar242 = psraw(auVar241,8);
              uVar224 = *puVar119;
              uVar196 = (undefined1)((uint)uVar224 >> 0x18);
              uVar194 = (undefined1)((uint)uVar224 >> 0x10);
              uVar193 = (undefined1)((uint)uVar224 >> 8);
              auVar171._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar196,uVar196),uVar194),
                                  CONCAT14(uVar194,uVar224)) >> 0x20);
              auVar171[3] = uVar193;
              auVar171[2] = uVar193;
              auVar171[0] = (undefined1)uVar224;
              auVar171[1] = auVar171[0];
              auVar171._8_8_ = 0;
              auVar172 = psraw(auVar171,8);
              sVar198 = auVar242._0_2_;
              auVar206._0_2_ = auVar202._0_2_ - sVar198;
              sVar250 = auVar242._2_2_;
              uVar217 = auVar202._2_2_ - sVar250;
              sVar251 = auVar242._4_2_;
              sVar219 = auVar202._4_2_ - sVar251;
              sVar253 = auVar242._6_2_;
              sVar221 = auVar202._6_2_ - sVar253;
              uVar224 = CONCAT22(sVar221,sVar219);
              uVar223 = auVar202._10_2_ - auVar242._10_2_;
              sVar268 = auVar226._0_2_;
              auVar270._0_2_ = sVar268 + sVar198;
              sVar269 = auVar226._2_2_;
              auVar270._2_2_ = sVar269 + sVar250;
              sVar274 = auVar226._4_2_;
              auVar270._4_2_ = sVar274 + sVar251;
              sVar275 = auVar226._6_2_;
              auVar270._6_2_ = sVar275 + sVar253;
              auVar270._8_2_ = auVar226._8_2_ + auVar242._8_2_;
              auVar270._10_2_ = auVar226._10_2_ + auVar242._10_2_;
              sVar250 = sVar250 - sVar269;
              uVar240 = CONCAT22(sVar250,sVar198 - sVar268);
              sVar253 = sVar253 - sVar275;
              auVar173._0_2_ = auVar172._0_2_ - sVar268;
              auVar173._2_2_ = auVar172._2_2_ - sVar269;
              auVar173._4_2_ = auVar172._4_2_ - sVar274;
              auVar173._6_2_ = auVar172._6_2_ - sVar275;
              auVar173._8_2_ = auVar172._8_2_ - auVar226._8_2_;
              auVar173._10_2_ = auVar172._10_2_ - auVar226._10_2_;
              auVar173._12_2_ = auVar172._12_2_ - auVar226._12_2_;
              auVar173._14_2_ = auVar172._14_2_ - auVar226._14_2_;
              auVar276._2_2_ = 0;
              auVar276._0_2_ = uVar217;
              auVar276._4_2_ = sVar221;
              auVar276._6_2_ = 0;
              auVar276._8_4_ = (uint)(((ulong)uVar223 << 0x30) >> 0x30);
              auVar254._0_8_ = CONCAT44(uVar224,uVar224);
              auVar254._8_4_ = uVar224;
              uVar116 = CONCAT24(auVar270._6_2_,CONCAT22(sVar221,uVar223));
              auVar115._2_4_ = (int)((uint6)uVar116 >> 0x10);
              auVar115._0_2_ = auVar270._4_2_;
              auVar115._6_6_ = 0;
              auVar112._2_2_ = auVar270._2_2_;
              auVar112._0_2_ = sVar219;
              auVar112._4_8_ = SUB128(auVar115 << 0x30,4);
              auVar78._2_10_ = auVar112._2_10_;
              auVar78._0_2_ = uVar217;
              auVar203._0_8_ = auVar78._0_8_ << 0x20;
              auVar276 = auVar270 & SUB1612(ZEXT416(0xffff0000),0) | auVar276;
              auVar258._12_2_ = sVar221;
              auVar258._0_12_ = auVar254;
              auVar258._14_2_ = auVar270._6_2_;
              auVar257._12_4_ = auVar258._12_4_;
              auVar257._0_10_ = auVar254._0_10_;
              auVar257._10_2_ = auVar270._4_2_;
              auVar256._10_6_ = auVar257._10_6_;
              auVar256._8_2_ = sVar219;
              auVar256._0_8_ = auVar254._0_8_;
              auVar255._8_8_ = auVar256._8_8_;
              auVar255._6_2_ = auVar270._6_2_;
              auVar255._4_2_ = sVar221;
              auVar255._0_4_ = uVar224;
              auVar259._0_8_ = auVar255._4_8_ << 0x20;
              uVar224 = CONCAT22(auVar270._6_2_,sVar221);
              uVar252 = (uint)(CONCAT26(sVar253,CONCAT24(sVar251 - sVar274,uVar240)) >> 0x20);
              auVar203._8_4_ = auVar78._0_4_;
              auVar203._12_4_ = uVar252;
              auVar226._4_8_ = auVar203._8_8_;
              auVar226._0_4_ = uVar240;
              auVar226._12_4_ = 0;
              auVar202._4_4_ = uVar252 >> 0x10;
              auVar202._0_4_ = auVar276._4_4_;
              auVar202._8_8_ = 0;
              auVar259._8_4_ = auVar255._4_4_;
              auVar259._12_4_ = uVar252;
              auVar242._4_8_ = auVar259._8_8_;
              auVar242._0_4_ = uVar252;
              auVar242._12_4_ = 0;
              auVar205._0_12_ = SUB1612(auVar226 << 0x20,0);
              auVar205._12_2_ = sVar250;
              auVar205._14_2_ = auVar173._6_2_;
              auVar204._12_4_ = auVar205._12_4_;
              auVar204._0_10_ = SUB1610(auVar226 << 0x20,0);
              auVar204._10_2_ = auVar173._4_2_;
              auVar113._4_2_ = sVar198 - sVar268;
              auVar113._0_4_ = uVar240;
              auVar113._6_6_ = auVar204._10_6_;
              auVar79._4_8_ = auVar113._4_8_;
              auVar79._2_2_ = auVar173._2_2_;
              auVar79._0_2_ = auVar270._0_2_;
              auVar206._2_2_ = auVar173._0_2_;
              auVar206._8_4_ = auVar113._4_4_;
              auVar206._4_4_ = auVar204._12_4_;
              auVar206._12_4_ = auVar79._0_4_;
              auVar172 = pshufhw(auVar206,auVar206,0xe8);
              auVar207._0_4_ = auVar172._0_4_;
              auVar207._8_4_ = auVar172._8_4_;
              auVar207._12_4_ = auVar172._12_4_;
              auVar207._4_4_ = auVar207._8_4_;
              auVar226 = pshuflw(auVar207,auVar207,0x6c);
              auVar278._0_12_ = SUB1612(auVar202 << 0x40,0);
              auVar278._12_2_ = 0;
              auVar278._14_2_ = auVar173._6_2_;
              auVar277._12_4_ = auVar278._12_4_;
              auVar277._0_10_ = SUB1610(auVar202 << 0x40,0);
              auVar277._10_2_ = auVar173._4_2_;
              uVar81 = CONCAT62(auVar277._10_6_,sVar250);
              auVar80._4_8_ = uVar81;
              auVar80._2_2_ = auVar173._2_2_;
              auVar80._0_2_ = auVar276._2_2_;
              auVar243._14_2_ = auVar173._0_2_;
              auVar243._12_2_ = auVar276._0_2_;
              auVar243._4_4_ = auVar80._0_4_;
              auVar243._0_4_ = auVar277._12_4_;
              auVar243._8_4_ = (int)uVar81;
              auVar172 = pshufhw(auVar243,auVar243,0xe8);
              auVar244._4_4_ = auVar172._4_4_;
              auVar244._8_4_ = auVar172._8_4_;
              auVar244._12_4_ = auVar172._12_4_;
              auVar244._0_4_ = auVar244._8_4_;
              in_XMM5 = pshuflw(auVar244,auVar244,0xc9);
              auVar262._0_12_ = SUB1612(auVar242 << 0x20,0);
              auVar262._12_2_ = sVar253;
              auVar262._14_2_ = auVar173._6_2_;
              auVar261._12_4_ = auVar262._12_4_;
              auVar261._0_10_ = SUB1610(auVar242 << 0x20,0);
              auVar261._10_2_ = auVar173._4_2_;
              auVar114._4_2_ = sVar251 - sVar274;
              auVar114._0_4_ = uVar252;
              auVar114._6_6_ = auVar261._10_6_;
              auVar260._8_8_ = auVar114._4_8_;
              auVar260._6_2_ = auVar173._2_2_;
              auVar260._4_2_ = auVar270._4_2_;
              auVar260._2_2_ = auVar173._0_2_;
              auVar260._0_2_ = sVar219;
              auVar202 = pshuflw(auVar260,auVar260,0xe8);
              in_XMM4 = ZEXT616(CONCAT24(sVar253,uVar224)) & auVar246;
              auVar242 = ~auVar246 & auVar173 | in_XMM4;
              sVar251 = auVar202._0_2_;
              sVar200 = auVar226._0_2_ - sVar251;
              sVar253 = auVar202._2_2_;
              sVar218 = auVar226._2_2_ - sVar253;
              sVar268 = auVar202._8_2_;
              sVar220 = auVar226._4_2_ - sVar268;
              sVar269 = auVar202._10_2_;
              sVar222 = auVar226._6_2_ - sVar269;
              auVar172._8_2_ = auVar226._8_2_ - sVar268;
              auVar172._0_2_ = sVar200;
              auVar172._2_2_ = sVar218;
              auVar172._4_2_ = sVar220;
              auVar172._6_2_ = sVar222;
              auVar172._10_2_ = auVar226._10_2_ - sVar269;
              auVar172._12_2_ = auVar226._12_2_ - auVar202._12_2_;
              auVar172._14_2_ = auVar226._14_2_ - auVar202._14_2_;
              d0[0] = sVar200;
              d0[1] = sVar218;
              d0[2] = sVar220;
              d0[3] = sVar222;
              sVar219 = in_XMM5._0_2_;
              sVar170 = sVar219 + sVar251;
              sVar221 = in_XMM5._2_2_;
              sVar195 = sVar221 + sVar253;
              sVar198 = in_XMM5._4_2_;
              sVar197 = sVar198 + sVar268;
              sVar250 = in_XMM5._6_2_;
              sVar199 = sVar250 + sVar269;
              d1[0] = sVar170;
              d1[1] = sVar195;
              d1[2] = sVar197;
              d1[3] = sVar199;
              d2[1] = sVar253 - sVar221;
              d2[0] = sVar251 - sVar219;
              d2[2] = sVar268 - sVar198;
              d2[3] = sVar269 - sVar250;
              d3[1] = auVar242._2_2_ - sVar221;
              d3[0] = auVar242._0_2_ - sVar219;
              d3[2] = auVar242._4_2_ - sVar198;
              d3[3] = auVar242._6_2_ - sVar250;
              aiStack_f0 = auVar156._8_8_;
              lVar120 = 0;
              do {
                *(undefined2 *)((long)pvVar125 + lVar120) = *(undefined2 *)((long)d0 + lVar120);
                *(undefined2 *)((long)pvVar125 + lVar120 + 8) = *(undefined2 *)((long)d1 + lVar120);
                *(undefined2 *)((long)pvVar125 + lVar120 + 0x10) =
                     *(undefined2 *)((long)d2 + lVar120);
                *(undefined2 *)((long)pvVar125 + lVar120 + 0x18) =
                     *(undefined2 *)((long)d3 + lVar120);
                lVar120 = lVar120 + 2;
              } while (lVar120 != 8);
              puVar151 = (undefined4 *)((long)puVar151 + 2);
              puVar140 = (undefined4 *)((long)puVar140 + 2);
              puVar142 = (undefined4 *)((long)puVar142 + 2);
              puVar119 = (undefined4 *)((long)puVar119 + 2);
              pvVar125 = (void *)((long)pvVar125 + 0x20);
              uVar135 = uVar135 + 1;
            } while (uVar135 != uVar118);
          }
          uVar146 = uVar146 + 1;
        } while (uVar146 != uVar133);
      }
      uVar137 = uVar137 + 1;
    } while (uVar137 != uVar121);
  }
  d0[0] = 0;
  d0[1] = 0;
  d0[2] = 0;
  d0[3] = 0;
  if (local_1b8.refcount != (int *)0x0) {
    LOCK();
    *local_1b8.refcount = *local_1b8.refcount + -1;
    UNLOCK();
    if (*local_1b8.refcount == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_1b8.cstep = 0;
  local_1b8.c = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.elempack = 0;
  local_1b8.elemsize = 0;
  local_1b8.refcount = (int *)0x0;
  local_1b8.data = (void *)d0;
  d0[0] = 0;
  d0[1] = 0;
  d0[2] = 0;
  d0[3] = 0;
  iVar153 = (int)uVar147;
  Mat::create((Mat *)d0,0x10,uVar132,iVar153,4,pOVar117->workspace_allocator);
  pOVar117 = local_318;
  uVar118 = iVar153 >> 2;
  uVar147 = uVar147 & 0xfffffffffffffffc;
  local_2b0 = (int *)(ulong)uVar132;
  if (0 < (int)uVar118) {
    local_390 = local_310->data;
    local_158 = local_310->elemsize;
    lVar120 = local_310->cstep * local_158;
    lVar129 = lVar120 * 4;
    local_398 = (long)local_390 + lVar120 + 0x60;
    local_3a0 = (long)local_390 + lVar120 * 2 + 0x60;
    local_2c0 = (void *)((long)local_390 + lVar120 * 3 + 0x60);
    local_2c8 = (void *)((long)local_390 + lVar120);
    local_2d0 = (void *)((long)local_390 + lVar120 * 2);
    local_2b8 = (void *)(lVar120 * 3 + (long)local_390);
    local_150 = 0;
    local_300[0] = d0[0];
    local_300[1] = d0[1];
    local_300[2] = d0[2];
    local_300[3] = d0[3];
    local_148 = 0;
    local_308[0] = d0[0];
    local_308[1] = d0[1];
    local_308[2] = d0[2];
    local_308[3] = d0[3];
    local_2f0[0] = d0[0];
    local_2f0[1] = d0[1];
    local_2f0[2] = d0[2];
    local_2f0[3] = d0[3];
    local_2f8[0] = d0[0];
    local_2f8[1] = d0[1];
    local_2f8[2] = d0[2];
    local_2f8[3] = d0[3];
    local_2d8 = (void *)((long)local_390 + 0x60);
    local_160 = local_158 * 4;
    uVar133 = 0;
    do {
      if (0 < (int)uVar132) {
        lVar122 = local_208.cstep * local_208.elemsize;
        lVar134 = local_158 * (long)local_310->w;
        lVar120 = lVar122 * 4;
        lVar136 = local_310->w * local_160;
        local_2e0 = (void *)(lVar122 * 3 + (long)local_208.data);
        local_3d0 = 0;
        piVar124 = (int *)0x0;
        do {
          uVar137 = 0;
          local_338 = 0;
          iStack_334 = 0;
          iStack_330 = 0;
          uStack_32c = 0;
          local_348 = (Allocator *)0x0;
          iStack_340 = 0;
          iStack_33c = 0;
          local_358 = 0;
          iStack_350 = 0;
          uStack_34c = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          aiStack_360[0] = 0;
          aiStack_360[1] = 0;
          local_108 = (undefined1  [16])0x0;
          local_118 = (undefined1  [16])0x0;
          local_128 = (undefined1  [16])0x0;
          _d2 = (undefined1  [16])0x0;
          local_c8 = (undefined1  [16])0x0;
          local_d8 = (undefined1  [16])0x0;
          local_e8 = (undefined1  [16])0x0;
          _d3 = (undefined1  [16])0x0;
          sum3[0xc] = 0;
          sum3[0xd] = 0;
          sum3[0xe] = 0;
          sum3[0xf] = 0;
          sum3[8] = 0;
          sum3[9] = 0;
          sum3[10] = 0;
          sum3[0xb] = 0;
          sum3[4] = 0;
          sum3[5] = 0;
          sum3[6] = 0;
          sum3[7] = 0;
          sum3[0] = 0;
          sum3[1] = 0;
          sum3[2] = 0;
          sum3[3] = 0;
          if (3 < (int)_c) {
            lVar148 = local_208.w * local_3d0;
            pvVar125 = (void *)((long)local_208.data + lVar148);
            lVar123 = (long)local_208.data + lVar148 + lVar122;
            lVar141 = (long)local_208.data + lVar148 + lVar122 * 2;
            pvVar149 = (void *)(lVar148 + (long)local_2e0);
            lVar148 = local_3a0;
            lVar126 = local_398;
            uVar146 = 0;
            pvVar130 = local_2d8;
            pvVar143 = local_2c0;
            do {
              lVar139 = 0;
              do {
                uVar137 = *(ulong *)((long)pvVar125 + lVar139);
                uVar167 = (undefined2)(uVar137 >> 0x30);
                auVar157._8_4_ = 0;
                auVar157._0_8_ = uVar137;
                auVar157._12_2_ = uVar167;
                auVar157._14_2_ = uVar167;
                uVar167 = (undefined2)(uVar137 >> 0x20);
                auVar246._12_4_ = auVar157._12_4_;
                auVar246._8_2_ = 0;
                auVar246._0_8_ = uVar137;
                auVar246._10_2_ = uVar167;
                auVar156._10_6_ = auVar246._10_6_;
                auVar156._8_2_ = uVar167;
                auVar156._0_8_ = uVar137;
                uVar167 = (undefined2)(uVar137 >> 0x10);
                auVar82._4_8_ = auVar156._8_8_;
                auVar82._2_2_ = uVar167;
                auVar82._0_2_ = uVar167;
                auVar158._0_4_ = (int)(short)uVar137;
                auVar158._4_4_ = auVar82._0_4_ >> 0x10;
                auVar158._8_4_ = auVar156._8_4_ >> 0x10;
                auVar158._12_4_ = auVar246._12_4_ >> 0x10;
                uVar137 = *(ulong *)((long)pvVar130 + lVar139 + -0x60);
                auVar9._8_4_ = 0;
                auVar9._0_8_ = uVar137;
                auVar9._12_2_ = (short)(uVar137 >> 0x30);
                auVar32._8_2_ = (short)(uVar137 >> 0x20);
                auVar32._0_8_ = uVar137;
                auVar32._10_4_ = auVar9._10_4_;
                auVar83._6_8_ = 0;
                auVar83._0_6_ = auVar32._8_6_;
                auVar68._4_2_ = (short)(uVar137 >> 0x10);
                auVar68._0_4_ = (uint)uVar137;
                auVar68._6_8_ = SUB148(auVar83 << 0x40,6);
                auVar245._0_4_ = (uint)uVar137 & 0xffff;
                auVar245._4_10_ = auVar68._4_10_;
                auVar245._14_2_ = 0;
                auVar246 = pmaddwd(auVar245,auVar158);
                iVar153 = *(int *)((long)aiStack_360 + lVar139 * 2);
                iVar155 = *(int *)((long)aiStack_360 + lVar139 * 2 + 4);
                uVar137 = *(ulong *)(lVar123 + lVar139);
                uVar167 = (undefined2)(uVar137 >> 0x30);
                auVar176._8_4_ = 0;
                auVar176._0_8_ = uVar137;
                auVar176._12_2_ = uVar167;
                auVar176._14_2_ = uVar167;
                uVar167 = (undefined2)(uVar137 >> 0x20);
                auVar175._12_4_ = auVar176._12_4_;
                auVar175._8_2_ = 0;
                auVar175._0_8_ = uVar137;
                auVar175._10_2_ = uVar167;
                auVar174._10_6_ = auVar175._10_6_;
                auVar174._8_2_ = uVar167;
                auVar174._0_8_ = uVar137;
                uVar167 = (undefined2)(uVar137 >> 0x10);
                auVar84._4_8_ = auVar174._8_8_;
                auVar84._2_2_ = uVar167;
                auVar84._0_2_ = uVar167;
                auVar177._0_4_ = (int)(short)uVar137;
                auVar177._4_4_ = auVar84._0_4_ >> 0x10;
                auVar177._8_4_ = auVar174._8_4_ >> 0x10;
                auVar177._12_4_ = auVar175._12_4_ >> 0x10;
                uVar137 = *(ulong *)((long)pvVar130 + lVar139 + -0x40);
                auVar10._8_4_ = 0;
                auVar10._0_8_ = uVar137;
                auVar10._12_2_ = (short)(uVar137 >> 0x30);
                auVar33._8_2_ = (short)(uVar137 >> 0x20);
                auVar33._0_8_ = uVar137;
                auVar33._10_4_ = auVar10._10_4_;
                auVar85._6_8_ = 0;
                auVar85._0_6_ = auVar33._8_6_;
                auVar69._4_2_ = (short)(uVar137 >> 0x10);
                auVar69._0_4_ = (uint)uVar137;
                auVar69._6_8_ = SUB148(auVar85 << 0x40,6);
                auVar227._0_4_ = (uint)uVar137 & 0xffff;
                auVar227._4_10_ = auVar69._4_10_;
                auVar227._14_2_ = 0;
                auVar172 = pmaddwd(auVar227,auVar177);
                uVar137 = *(ulong *)(lVar141 + lVar139);
                uVar167 = (undefined2)(uVar137 >> 0x30);
                auVar210._8_4_ = 0;
                auVar210._0_8_ = uVar137;
                auVar210._12_2_ = uVar167;
                auVar210._14_2_ = uVar167;
                uVar167 = (undefined2)(uVar137 >> 0x20);
                auVar209._12_4_ = auVar210._12_4_;
                auVar209._8_2_ = 0;
                auVar209._0_8_ = uVar137;
                auVar209._10_2_ = uVar167;
                auVar208._10_6_ = auVar209._10_6_;
                auVar208._8_2_ = uVar167;
                auVar208._0_8_ = uVar137;
                uVar167 = (undefined2)(uVar137 >> 0x10);
                auVar86._4_8_ = auVar208._8_8_;
                auVar86._2_2_ = uVar167;
                auVar86._0_2_ = uVar167;
                auVar211._0_4_ = (int)(short)uVar137;
                auVar211._4_4_ = auVar86._0_4_ >> 0x10;
                auVar211._8_4_ = auVar208._8_4_ >> 0x10;
                auVar211._12_4_ = auVar209._12_4_ >> 0x10;
                uVar137 = *(ulong *)((long)pvVar130 + lVar139 + -0x20);
                auVar11._8_4_ = 0;
                auVar11._0_8_ = uVar137;
                auVar11._12_2_ = (short)(uVar137 >> 0x30);
                auVar34._8_2_ = (short)(uVar137 >> 0x20);
                auVar34._0_8_ = uVar137;
                auVar34._10_4_ = auVar11._10_4_;
                auVar87._6_8_ = 0;
                auVar87._0_6_ = auVar34._8_6_;
                auVar263._6_8_ = SUB148(auVar87 << 0x40,6);
                auVar263._4_2_ = (short)(uVar137 >> 0x10);
                auVar263._0_2_ = (ushort)uVar137;
                auVar263._2_2_ = 0;
                auVar263._14_2_ = 0;
                auVar202 = pmaddwd(auVar263,auVar211);
                uVar137 = *(ulong *)((long)pvVar149 + lVar139);
                uVar167 = (undefined2)(uVar137 >> 0x30);
                auVar230._8_4_ = 0;
                auVar230._0_8_ = uVar137;
                auVar230._12_2_ = uVar167;
                auVar230._14_2_ = uVar167;
                uVar167 = (undefined2)(uVar137 >> 0x20);
                auVar229._12_4_ = auVar230._12_4_;
                auVar229._8_2_ = 0;
                auVar229._0_8_ = uVar137;
                auVar229._10_2_ = uVar167;
                auVar228._10_6_ = auVar229._10_6_;
                auVar228._8_2_ = uVar167;
                auVar228._0_8_ = uVar137;
                uVar167 = (undefined2)(uVar137 >> 0x10);
                auVar88._4_8_ = auVar228._8_8_;
                auVar88._2_2_ = uVar167;
                auVar88._0_2_ = uVar167;
                auVar231._0_4_ = (int)(short)uVar137;
                auVar231._4_4_ = auVar88._0_4_ >> 0x10;
                auVar231._8_4_ = auVar228._8_4_ >> 0x10;
                auVar231._12_4_ = auVar229._12_4_ >> 0x10;
                uVar137 = *(ulong *)((long)pvVar130 + lVar139);
                auVar12._8_4_ = 0;
                auVar12._0_8_ = uVar137;
                auVar12._12_2_ = (short)(uVar137 >> 0x30);
                auVar35._8_2_ = (short)(uVar137 >> 0x20);
                auVar35._0_8_ = uVar137;
                auVar35._10_4_ = auVar12._10_4_;
                auVar89._6_8_ = 0;
                auVar89._0_6_ = auVar35._8_6_;
                auVar271._6_8_ = SUB148(auVar89 << 0x40,6);
                auVar271._4_2_ = (short)(uVar137 >> 0x10);
                auVar271._0_2_ = (ushort)uVar137;
                auVar271._2_2_ = 0;
                auVar271._14_2_ = 0;
                auVar226 = pmaddwd(auVar271,auVar231);
                *(int *)(d1 + lVar139) =
                     auVar226._0_4_ + auVar202._0_4_ + auVar172._0_4_ +
                     auVar246._0_4_ + *(int *)(d1 + lVar139);
                *(int *)(d1 + lVar139 + 2) =
                     auVar226._4_4_ + auVar202._4_4_ + auVar172._4_4_ +
                     auVar246._4_4_ + *(int *)(d1 + lVar139 + 2);
                *(int *)((long)aiStack_360 + lVar139 * 2) =
                     auVar226._8_4_ + auVar202._8_4_ + auVar172._8_4_ + auVar246._8_4_ + iVar153;
                *(int *)((long)aiStack_360 + lVar139 * 2 + 4) =
                     auVar226._12_4_ + auVar202._12_4_ + auVar172._12_4_ + auVar246._12_4_ + iVar155
                ;
                uVar137 = *(ulong *)(lVar126 + -0x60 + lVar139);
                auVar13._8_4_ = 0;
                auVar13._0_8_ = uVar137;
                auVar13._12_2_ = (short)(uVar137 >> 0x30);
                auVar36._8_2_ = (short)(uVar137 >> 0x20);
                auVar36._0_8_ = uVar137;
                auVar36._10_4_ = auVar13._10_4_;
                auVar90._6_8_ = 0;
                auVar90._0_6_ = auVar36._8_6_;
                auVar247._6_8_ = SUB148(auVar90 << 0x40,6);
                auVar247._4_2_ = (short)(uVar137 >> 0x10);
                auVar247._0_2_ = (ushort)uVar137;
                auVar247._2_2_ = 0;
                auVar247._14_2_ = 0;
                auVar172 = pmaddwd(auVar247,auVar158);
                iVar153 = *(int *)((long)aiStack_130 + lVar139 * 2);
                iVar155 = *(int *)(local_128 + lVar139 * 2 + -4);
                uVar137 = *(ulong *)(lVar126 + -0x40 + lVar139);
                auVar14._8_4_ = 0;
                auVar14._0_8_ = uVar137;
                auVar14._12_2_ = (short)(uVar137 >> 0x30);
                auVar37._8_2_ = (short)(uVar137 >> 0x20);
                auVar37._0_8_ = uVar137;
                auVar37._10_4_ = auVar14._10_4_;
                auVar91._6_8_ = 0;
                auVar91._0_6_ = auVar37._8_6_;
                auVar264._6_8_ = SUB148(auVar91 << 0x40,6);
                auVar264._4_2_ = (short)(uVar137 >> 0x10);
                auVar264._0_2_ = (ushort)uVar137;
                auVar264._2_2_ = 0;
                auVar264._14_2_ = 0;
                auVar246 = pmaddwd(auVar264,auVar177);
                uVar137 = *(ulong *)(lVar126 + -0x20 + lVar139);
                auVar15._8_4_ = 0;
                auVar15._0_8_ = uVar137;
                auVar15._12_2_ = (short)(uVar137 >> 0x30);
                auVar38._8_2_ = (short)(uVar137 >> 0x20);
                auVar38._0_8_ = uVar137;
                auVar38._10_4_ = auVar15._10_4_;
                auVar92._6_8_ = 0;
                auVar92._0_6_ = auVar38._8_6_;
                auVar272._6_8_ = SUB148(auVar92 << 0x40,6);
                auVar272._4_2_ = (short)(uVar137 >> 0x10);
                auVar272._0_2_ = (ushort)uVar137;
                auVar272._2_2_ = 0;
                auVar272._14_2_ = 0;
                auVar226 = pmaddwd(auVar272,auVar211);
                uVar137 = *(ulong *)(lVar126 + lVar139);
                auVar16._8_4_ = 0;
                auVar16._0_8_ = uVar137;
                auVar16._12_2_ = (short)(uVar137 >> 0x30);
                auVar39._8_2_ = (short)(uVar137 >> 0x20);
                auVar39._0_8_ = uVar137;
                auVar39._10_4_ = auVar16._10_4_;
                auVar93._6_8_ = 0;
                auVar93._0_6_ = auVar39._8_6_;
                auVar265._6_8_ = SUB148(auVar93 << 0x40,6);
                auVar265._4_2_ = (short)(uVar137 >> 0x10);
                auVar265._0_2_ = (ushort)uVar137;
                auVar265._2_2_ = 0;
                auVar265._14_2_ = 0;
                auVar202 = pmaddwd(auVar265,auVar231);
                *(int *)(d2 + lVar139) =
                     auVar202._0_4_ + auVar226._0_4_ + auVar246._0_4_ +
                     auVar172._0_4_ + *(int *)(d2 + lVar139);
                *(int *)(d2 + lVar139 + 2) =
                     auVar202._4_4_ + auVar226._4_4_ + auVar246._4_4_ +
                     auVar172._4_4_ + *(int *)(d2 + lVar139 + 2);
                *(int *)((long)aiStack_130 + lVar139 * 2) =
                     auVar202._8_4_ + auVar226._8_4_ + auVar246._8_4_ + auVar172._8_4_ + iVar153;
                *(int *)(local_128 + lVar139 * 2 + -4) =
                     auVar202._12_4_ + auVar226._12_4_ + auVar246._12_4_ + auVar172._12_4_ + iVar155
                ;
                uVar137 = *(ulong *)(lVar148 + -0x60 + lVar139);
                auVar17._8_4_ = 0;
                auVar17._0_8_ = uVar137;
                auVar17._12_2_ = (short)(uVar137 >> 0x30);
                auVar40._8_2_ = (short)(uVar137 >> 0x20);
                auVar40._0_8_ = uVar137;
                auVar40._10_4_ = auVar17._10_4_;
                auVar94._6_8_ = 0;
                auVar94._0_6_ = auVar40._8_6_;
                auVar248._6_8_ = SUB148(auVar94 << 0x40,6);
                auVar248._4_2_ = (short)(uVar137 >> 0x10);
                auVar248._0_2_ = (ushort)uVar137;
                auVar248._2_2_ = 0;
                auVar248._14_2_ = 0;
                auVar172 = pmaddwd(auVar248,auVar158);
                iVar153 = *(int *)((long)aiStack_f0 + lVar139 * 2);
                iVar155 = *(int *)(local_e8 + lVar139 * 2 + -4);
                uVar137 = *(ulong *)(lVar148 + -0x40 + lVar139);
                auVar18._8_4_ = 0;
                auVar18._0_8_ = uVar137;
                auVar18._12_2_ = (short)(uVar137 >> 0x30);
                auVar41._8_2_ = (short)(uVar137 >> 0x20);
                auVar41._0_8_ = uVar137;
                auVar41._10_4_ = auVar18._10_4_;
                auVar95._6_8_ = 0;
                auVar95._0_6_ = auVar41._8_6_;
                auVar266._6_8_ = SUB148(auVar95 << 0x40,6);
                auVar266._4_2_ = (short)(uVar137 >> 0x10);
                auVar266._0_2_ = (ushort)uVar137;
                auVar266._2_2_ = 0;
                auVar266._14_2_ = 0;
                auVar246 = pmaddwd(auVar266,auVar177);
                uVar137 = *(ulong *)(lVar148 + -0x20 + lVar139);
                auVar19._8_4_ = 0;
                auVar19._0_8_ = uVar137;
                auVar19._12_2_ = (short)(uVar137 >> 0x30);
                auVar42._8_2_ = (short)(uVar137 >> 0x20);
                auVar42._0_8_ = uVar137;
                auVar42._10_4_ = auVar19._10_4_;
                auVar96._6_8_ = 0;
                auVar96._0_6_ = auVar42._8_6_;
                auVar273._6_8_ = SUB148(auVar96 << 0x40,6);
                auVar273._4_2_ = (short)(uVar137 >> 0x10);
                auVar273._0_2_ = (ushort)uVar137;
                auVar273._2_2_ = 0;
                auVar273._14_2_ = 0;
                auVar226 = pmaddwd(auVar273,auVar211);
                uVar137 = *(ulong *)(lVar148 + lVar139);
                auVar20._8_4_ = 0;
                auVar20._0_8_ = uVar137;
                auVar20._12_2_ = (short)(uVar137 >> 0x30);
                auVar43._8_2_ = (short)(uVar137 >> 0x20);
                auVar43._0_8_ = uVar137;
                auVar43._10_4_ = auVar20._10_4_;
                auVar97._6_8_ = 0;
                auVar97._0_6_ = auVar43._8_6_;
                auVar267._6_8_ = SUB148(auVar97 << 0x40,6);
                auVar267._4_2_ = (short)(uVar137 >> 0x10);
                auVar267._0_2_ = (ushort)uVar137;
                auVar267._2_2_ = 0;
                auVar267._14_2_ = 0;
                auVar202 = pmaddwd(auVar267,auVar231);
                *(int *)(d3 + lVar139) =
                     auVar202._0_4_ + auVar226._0_4_ + auVar246._0_4_ +
                     auVar172._0_4_ + *(int *)(d3 + lVar139);
                *(int *)(d3 + lVar139 + 2) =
                     auVar202._4_4_ + auVar226._4_4_ + auVar246._4_4_ +
                     auVar172._4_4_ + *(int *)(d3 + lVar139 + 2);
                *(int *)((long)aiStack_f0 + lVar139 * 2) =
                     auVar202._8_4_ + auVar226._8_4_ + auVar246._8_4_ + auVar172._8_4_ + iVar153;
                *(int *)(local_e8 + lVar139 * 2 + -4) =
                     auVar202._12_4_ + auVar226._12_4_ + auVar246._12_4_ + auVar172._12_4_ + iVar155
                ;
                uVar137 = *(ulong *)((long)pvVar143 + lVar139 + -0x60);
                auVar21._8_4_ = 0;
                auVar21._0_8_ = uVar137;
                auVar21._12_2_ = (short)(uVar137 >> 0x30);
                auVar44._8_2_ = (short)(uVar137 >> 0x20);
                auVar44._0_8_ = uVar137;
                auVar44._10_4_ = auVar21._10_4_;
                auVar98._6_8_ = 0;
                auVar98._0_6_ = auVar44._8_6_;
                auVar249._6_8_ = SUB148(auVar98 << 0x40,6);
                auVar249._4_2_ = (short)(uVar137 >> 0x10);
                auVar249._0_2_ = (ushort)uVar137;
                auVar249._2_2_ = 0;
                auVar249._14_2_ = 0;
                auVar226 = pmaddwd(auVar249,auVar158);
                lVar1 = lVar139 * 2;
                iVar153 = *(int *)((long)sum3 + lVar1 + 4);
                iVar155 = *(int *)((long)sum3 + lVar1 + 8);
                iVar128 = *(int *)((long)sum3 + lVar1 + 0xc);
                uVar137 = *(ulong *)((long)pvVar143 + lVar139 + -0x40);
                auVar22._8_4_ = 0;
                auVar22._0_8_ = uVar137;
                auVar22._12_2_ = (short)(uVar137 >> 0x30);
                auVar45._8_2_ = (short)(uVar137 >> 0x20);
                auVar45._0_8_ = uVar137;
                auVar45._10_4_ = auVar22._10_4_;
                auVar99._6_8_ = 0;
                auVar99._0_6_ = auVar45._8_6_;
                auVar159._6_8_ = SUB148(auVar99 << 0x40,6);
                auVar159._4_2_ = (short)(uVar137 >> 0x10);
                auVar159._0_2_ = (ushort)uVar137;
                auVar159._2_2_ = 0;
                auVar159._14_2_ = 0;
                auVar172 = pmaddwd(auVar159,auVar177);
                uVar137 = *(ulong *)((long)pvVar143 + lVar139 + -0x20);
                auVar23._8_4_ = 0;
                auVar23._0_8_ = uVar137;
                auVar23._12_2_ = (short)(uVar137 >> 0x30);
                auVar46._8_2_ = (short)(uVar137 >> 0x20);
                auVar46._0_8_ = uVar137;
                auVar46._10_4_ = auVar23._10_4_;
                auVar100._6_8_ = 0;
                auVar100._0_6_ = auVar46._8_6_;
                auVar178._6_8_ = SUB148(auVar100 << 0x40,6);
                auVar178._4_2_ = (short)(uVar137 >> 0x10);
                auVar178._0_2_ = (ushort)uVar137;
                auVar178._2_2_ = 0;
                auVar178._14_2_ = 0;
                auVar202 = pmaddwd(auVar178,auVar211);
                uVar137 = *(ulong *)((long)pvVar143 + lVar139);
                auVar24._8_4_ = 0;
                auVar24._0_8_ = uVar137;
                auVar24._12_2_ = (short)(uVar137 >> 0x30);
                auVar47._8_2_ = (short)(uVar137 >> 0x20);
                auVar47._0_8_ = uVar137;
                auVar47._10_4_ = auVar24._10_4_;
                auVar101._6_8_ = 0;
                auVar101._0_6_ = auVar47._8_6_;
                auVar160._6_8_ = SUB148(auVar101 << 0x40,6);
                auVar160._4_2_ = (short)(uVar137 >> 0x10);
                auVar160._0_2_ = (ushort)uVar137;
                auVar160._2_2_ = 0;
                auVar160._14_2_ = 0;
                auVar246 = pmaddwd(auVar160,auVar231);
                lVar2 = lVar139 * 2;
                *(int *)((long)sum3 + lVar2) =
                     auVar246._0_4_ + auVar202._0_4_ + auVar172._0_4_ +
                     auVar226._0_4_ + *(int *)((long)sum3 + lVar1);
                *(int *)((long)sum3 + lVar2 + 4) =
                     auVar246._4_4_ + auVar202._4_4_ + auVar172._4_4_ + auVar226._4_4_ + iVar153;
                *(int *)((long)sum3 + lVar2 + 8) =
                     auVar246._8_4_ + auVar202._8_4_ + auVar172._8_4_ + auVar226._8_4_ + iVar155;
                *(int *)((long)sum3 + lVar2 + 0xc) =
                     auVar246._12_4_ + auVar202._12_4_ + auVar172._12_4_ + auVar226._12_4_ + iVar128
                ;
                lVar139 = lVar139 + 8;
              } while (lVar139 != 0x20);
              uVar137 = uVar146 + 4;
              lVar139 = uVar146 + 7;
              pvVar125 = (void *)((long)pvVar125 + lVar120);
              pvVar130 = (void *)((long)pvVar130 + lVar136);
              lVar123 = lVar123 + lVar120;
              lVar141 = lVar141 + lVar120;
              pvVar149 = (void *)((long)pvVar149 + lVar120);
              lVar126 = lVar126 + lVar136;
              lVar148 = lVar148 + lVar136;
              pvVar143 = (void *)((long)pvVar143 + lVar136);
              uVar146 = uVar137;
            } while (lVar139 < (int)_c);
          }
          if ((int)uVar137 < (int)_c) {
            uVar137 = uVar137 & 0xffffffff;
            lVar123 = (long)local_208.data + local_208.w * local_3d0 + lVar122 * uVar137;
            lVar141 = lVar134 * uVar137;
            pvVar130 = (void *)((long)local_390 + lVar141);
            pvVar143 = (void *)((long)local_2c8 + lVar141);
            pvVar149 = (void *)((long)local_2d0 + lVar141);
            pvVar125 = (void *)(lVar141 + (long)local_2b8);
            do {
              lVar141 = 0;
              do {
                uVar146 = *(ulong *)(lVar123 + lVar141);
                uVar167 = (undefined2)(uVar146 >> 0x30);
                auVar163._8_4_ = 0;
                auVar163._0_8_ = uVar146;
                auVar163._12_2_ = uVar167;
                auVar163._14_2_ = uVar167;
                uVar167 = (undefined2)(uVar146 >> 0x20);
                auVar162._12_4_ = auVar163._12_4_;
                auVar162._8_2_ = 0;
                auVar162._0_8_ = uVar146;
                auVar162._10_2_ = uVar167;
                auVar161._10_6_ = auVar162._10_6_;
                auVar161._8_2_ = uVar167;
                auVar161._0_8_ = uVar146;
                uVar167 = (undefined2)(uVar146 >> 0x10);
                auVar102._4_8_ = auVar161._8_8_;
                auVar102._2_2_ = uVar167;
                auVar102._0_2_ = uVar167;
                auVar164._0_4_ = (int)(short)uVar146;
                auVar164._4_4_ = auVar102._0_4_ >> 0x10;
                auVar164._8_4_ = auVar161._8_4_ >> 0x10;
                auVar164._12_4_ = auVar162._12_4_ >> 0x10;
                uVar146 = *(ulong *)((long)pvVar130 + lVar141);
                auVar25._8_4_ = 0;
                auVar25._0_8_ = uVar146;
                auVar25._12_2_ = (short)(uVar146 >> 0x30);
                auVar48._8_2_ = (short)(uVar146 >> 0x20);
                auVar48._0_8_ = uVar146;
                auVar48._10_4_ = auVar25._10_4_;
                auVar103._6_8_ = 0;
                auVar103._0_6_ = auVar48._8_6_;
                auVar179._6_8_ = SUB148(auVar103 << 0x40,6);
                auVar179._4_2_ = (short)(uVar146 >> 0x10);
                auVar179._0_2_ = (ushort)uVar146;
                auVar179._2_2_ = 0;
                auVar179._14_2_ = 0;
                auVar172 = pmaddwd(auVar179,auVar164);
                iVar153 = *(int *)((long)aiStack_360 + lVar141 * 2);
                iVar155 = *(int *)((long)aiStack_360 + lVar141 * 2 + 4);
                *(int *)(d1 + lVar141) = auVar172._0_4_ + *(int *)(d1 + lVar141);
                *(int *)(d1 + lVar141 + 2) = auVar172._4_4_ + *(int *)(d1 + lVar141 + 2);
                *(int *)((long)aiStack_360 + lVar141 * 2) = auVar172._8_4_ + iVar153;
                *(int *)((long)aiStack_360 + lVar141 * 2 + 4) = auVar172._12_4_ + iVar155;
                uVar146 = *(ulong *)((long)pvVar143 + lVar141);
                auVar26._8_4_ = 0;
                auVar26._0_8_ = uVar146;
                auVar26._12_2_ = (short)(uVar146 >> 0x30);
                auVar49._8_2_ = (short)(uVar146 >> 0x20);
                auVar49._0_8_ = uVar146;
                auVar49._10_4_ = auVar26._10_4_;
                auVar104._6_8_ = 0;
                auVar104._0_6_ = auVar49._8_6_;
                auVar180._6_8_ = SUB148(auVar104 << 0x40,6);
                auVar180._4_2_ = (short)(uVar146 >> 0x10);
                auVar180._0_2_ = (ushort)uVar146;
                auVar180._2_2_ = 0;
                auVar180._14_2_ = 0;
                auVar172 = pmaddwd(auVar180,auVar164);
                iVar153 = *(int *)((long)aiStack_130 + lVar141 * 2);
                iVar155 = *(int *)(local_128 + lVar141 * 2 + -4);
                *(int *)(d2 + lVar141) = auVar172._0_4_ + *(int *)(d2 + lVar141);
                *(int *)(d2 + lVar141 + 2) = auVar172._4_4_ + *(int *)(d2 + lVar141 + 2);
                *(int *)((long)aiStack_130 + lVar141 * 2) = auVar172._8_4_ + iVar153;
                *(int *)(local_128 + lVar141 * 2 + -4) = auVar172._12_4_ + iVar155;
                uVar146 = *(ulong *)((long)pvVar149 + lVar141);
                auVar27._8_4_ = 0;
                auVar27._0_8_ = uVar146;
                auVar27._12_2_ = (short)(uVar146 >> 0x30);
                auVar50._8_2_ = (short)(uVar146 >> 0x20);
                auVar50._0_8_ = uVar146;
                auVar50._10_4_ = auVar27._10_4_;
                auVar105._6_8_ = 0;
                auVar105._0_6_ = auVar50._8_6_;
                auVar181._6_8_ = SUB148(auVar105 << 0x40,6);
                auVar181._4_2_ = (short)(uVar146 >> 0x10);
                auVar181._0_2_ = (ushort)uVar146;
                auVar181._2_2_ = 0;
                auVar181._14_2_ = 0;
                auVar172 = pmaddwd(auVar181,auVar164);
                iVar153 = *(int *)((long)aiStack_f0 + lVar141 * 2);
                iVar155 = *(int *)(local_e8 + lVar141 * 2 + -4);
                *(int *)(d3 + lVar141) = auVar172._0_4_ + *(int *)(d3 + lVar141);
                *(int *)(d3 + lVar141 + 2) = auVar172._4_4_ + *(int *)(d3 + lVar141 + 2);
                *(int *)((long)aiStack_f0 + lVar141 * 2) = auVar172._8_4_ + iVar153;
                *(int *)(local_e8 + lVar141 * 2 + -4) = auVar172._12_4_ + iVar155;
                uVar146 = *(ulong *)((long)pvVar125 + lVar141);
                auVar28._8_4_ = 0;
                auVar28._0_8_ = uVar146;
                auVar28._12_2_ = (short)(uVar146 >> 0x30);
                auVar51._8_2_ = (short)(uVar146 >> 0x20);
                auVar51._0_8_ = uVar146;
                auVar51._10_4_ = auVar28._10_4_;
                auVar106._6_8_ = 0;
                auVar106._0_6_ = auVar51._8_6_;
                auVar182._6_8_ = SUB148(auVar106 << 0x40,6);
                auVar182._4_2_ = (short)(uVar146 >> 0x10);
                auVar182._0_2_ = (ushort)uVar146;
                auVar182._2_2_ = 0;
                auVar182._14_2_ = 0;
                auVar172 = pmaddwd(auVar182,auVar164);
                lVar148 = lVar141 * 2;
                iVar153 = *(int *)((long)sum3 + lVar148 + 4);
                iVar155 = *(int *)((long)sum3 + lVar148 + 8);
                iVar128 = *(int *)((long)sum3 + lVar148 + 0xc);
                lVar126 = lVar141 * 2;
                *(int *)((long)sum3 + lVar126) = auVar172._0_4_ + *(int *)((long)sum3 + lVar148);
                *(int *)((long)sum3 + lVar126 + 4) = auVar172._4_4_ + iVar153;
                *(int *)((long)sum3 + lVar126 + 8) = auVar172._8_4_ + iVar155;
                *(int *)((long)sum3 + lVar126 + 0xc) = auVar172._12_4_ + iVar128;
                lVar141 = lVar141 + 8;
              } while (lVar141 != 0x20);
              uVar137 = uVar137 + 1;
              lVar123 = lVar123 + lVar122;
              pvVar130 = (void *)((long)pvVar130 + lVar134);
              pvVar143 = (void *)((long)pvVar143 + lVar134);
              pvVar149 = (void *)((long)pvVar149 + lVar134);
              pvVar125 = (void *)((long)pvVar125 + lVar134);
            } while (uVar137 != uVar121);
          }
          lVar123 = 0;
          do {
            *(undefined4 *)((long)d0 + lVar123) = *(undefined4 *)((long)d1 + lVar123);
            *(undefined4 *)((long)d0 + lVar123) = *(undefined4 *)((long)d2 + lVar123);
            *(undefined4 *)((long)d0 + lVar123) = *(undefined4 *)((long)d3 + lVar123);
            *(undefined4 *)((long)d0 + lVar123) = *(undefined4 *)((long)sum3 + lVar123);
            lVar123 = lVar123 + 4;
          } while (lVar123 != 0x40);
          piVar124 = (int *)((long)piVar124 + 1);
          local_3d0 = local_3d0 + local_208.elemsize;
        } while (piVar124 != local_2b0);
      }
      uVar133 = uVar133 + 1;
      local_2d8 = (void *)((long)local_2d8 + lVar129);
      local_398 = local_398 + lVar129;
      local_3a0 = local_3a0 + lVar129;
      local_2c0 = (void *)((long)local_2c0 + lVar129);
      local_390 = (void *)((long)local_390 + lVar129);
      local_2c8 = (void *)((long)local_2c8 + lVar129);
      local_2d0 = (void *)((long)local_2d0 + lVar129);
      local_2b8 = (void *)((long)local_2b8 + lVar129);
    } while (uVar133 != uVar118);
  }
  local_258 = (int)uVar147;
  iVar153 = (int)local_2e8;
  if (local_258 != iVar153) {
    local_2f0[0] = d0[0];
    local_2f0[1] = d0[1];
    local_2f0[2] = d0[2];
    local_2f0[3] = d0[3];
    local_3c0 = local_310->data;
    sVar5 = local_310->elemsize;
    lVar129 = local_310->cstep * sVar5;
    local_2f8[0] = 0;
    local_2f8[1] = 0;
    local_2f8[2] = 0;
    local_2f8[3] = 0;
    local_300[0] = 0;
    local_300[1] = 0;
    local_300[2] = 0;
    local_300[3] = 0;
    local_3d8 = (void *)(lVar129 * uVar147 + (long)local_3c0);
    local_308 = (short  [4])(sVar5 * 4);
    lVar120 = local_310->cstep * uVar147;
    local_2e0 = (void *)0x0;
    do {
      if (0 < (int)uVar132) {
        lVar136 = (long)local_310->w;
        lVar123 = local_208.cstep * local_208.elemsize;
        lVar122 = lVar123 * 4;
        lVar134 = (long)local_308 * lVar136;
        local_2b8 = (void *)((long)local_208.data + lVar123);
        local_2c0 = (void *)((long)local_3d8 + sVar5 * lVar136);
        local_2c8 = (void *)((long)local_208.data + lVar123 * 2);
        local_2d0 = (void *)(sVar5 * 2 * lVar136 + (long)local_3d8);
        local_2d8 = (void *)(lVar123 * 3 + (long)local_208.data);
        local_3c8 = 0;
        piVar124 = (int *)0x0;
        do {
          uVar133 = 0;
          local_338 = 0;
          iStack_334 = 0;
          iStack_330 = 0;
          uStack_32c = 0;
          local_348 = (Allocator *)0x0;
          iStack_340 = 0;
          iStack_33c = 0;
          local_358 = 0;
          iStack_350 = 0;
          uStack_34c = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          aiStack_360[0] = 0;
          aiStack_360[1] = 0;
          if (3 < (int)_c) {
            lVar141 = local_208.w * local_3c8;
            pvVar125 = (void *)((long)local_208.data + lVar141);
            pvVar130 = (void *)((long)local_2b8 + lVar141);
            pvVar143 = (void *)((long)local_2c8 + lVar141);
            pvVar127 = (void *)(lVar141 + (long)local_2d8);
            pvVar149 = local_3d8;
            uVar137 = 0;
            pvVar138 = (void *)(sVar5 * 3 * lVar136 + (long)local_3d8);
            pvVar144 = local_2c0;
            pvVar152 = local_2d0;
            do {
              lVar141 = 0;
              do {
                uVar133 = *(ulong *)((long)pvVar125 + lVar141);
                uVar146 = *(ulong *)((long)pvVar149 + lVar141);
                uVar167 = (undefined2)(uVar146 >> 0x30);
                auVar186._8_4_ = 0;
                auVar186._0_8_ = uVar146;
                auVar186._12_2_ = uVar167;
                auVar186._14_2_ = uVar167;
                uVar167 = (undefined2)(uVar146 >> 0x20);
                auVar185._12_4_ = auVar186._12_4_;
                auVar185._8_2_ = 0;
                auVar185._0_8_ = uVar146;
                auVar185._10_2_ = uVar167;
                auVar184._10_6_ = auVar185._10_6_;
                auVar184._8_2_ = uVar167;
                auVar184._0_8_ = uVar146;
                uVar167 = (undefined2)(uVar146 >> 0x10);
                auVar183._8_8_ = auVar184._8_8_;
                auVar183._6_2_ = uVar167;
                auVar183._4_2_ = uVar167;
                auVar183._0_2_ = (undefined2)uVar146;
                auVar183._2_2_ = auVar183._0_2_;
                auVar52._8_4_ = 0;
                auVar52._0_8_ = uVar133;
                auVar52._12_2_ = (short)(uVar133 >> 0x30);
                auVar60._8_2_ = (short)(uVar133 >> 0x20);
                auVar60._0_8_ = uVar133;
                auVar60._10_4_ = auVar52._10_4_;
                auVar107._6_8_ = 0;
                auVar107._0_6_ = auVar60._8_6_;
                auVar73._4_2_ = (short)(uVar133 >> 0x10);
                auVar73._0_4_ = (uint)uVar133;
                auVar73._6_8_ = SUB148(auVar107 << 0x40,6);
                auVar165._0_4_ = (uint)uVar133 & 0xffff;
                auVar165._4_10_ = auVar73._4_10_;
                auVar165._14_2_ = 0;
                auVar172 = pmaddwd(auVar165,auVar183);
                iVar155 = *(int *)((long)aiStack_360 + lVar141 * 2);
                iVar128 = *(int *)((long)aiStack_360 + lVar141 * 2 + 4);
                uVar133 = *(ulong *)((long)pvVar130 + lVar141);
                uVar146 = *(ulong *)((long)pvVar144 + lVar141);
                uVar167 = (undefined2)(uVar146 >> 0x30);
                auVar215._8_4_ = 0;
                auVar215._0_8_ = uVar146;
                auVar215._12_2_ = uVar167;
                auVar215._14_2_ = uVar167;
                uVar167 = (undefined2)(uVar146 >> 0x20);
                auVar214._12_4_ = auVar215._12_4_;
                auVar214._8_2_ = 0;
                auVar214._0_8_ = uVar146;
                auVar214._10_2_ = uVar167;
                auVar213._10_6_ = auVar214._10_6_;
                auVar213._8_2_ = uVar167;
                auVar213._0_8_ = uVar146;
                uVar167 = (undefined2)(uVar146 >> 0x10);
                auVar212._8_8_ = auVar213._8_8_;
                auVar212._6_2_ = uVar167;
                auVar212._4_2_ = uVar167;
                auVar212._0_2_ = (undefined2)uVar146;
                auVar212._2_2_ = auVar212._0_2_;
                auVar53._8_4_ = 0;
                auVar53._0_8_ = uVar133;
                auVar53._12_2_ = (short)(uVar133 >> 0x30);
                auVar61._8_2_ = (short)(uVar133 >> 0x20);
                auVar61._0_8_ = uVar133;
                auVar61._10_4_ = auVar53._10_4_;
                auVar108._6_8_ = 0;
                auVar108._0_6_ = auVar61._8_6_;
                auVar74._4_2_ = (short)(uVar133 >> 0x10);
                auVar74._0_4_ = (uint)uVar133;
                auVar74._6_8_ = SUB148(auVar108 << 0x40,6);
                auVar187._0_4_ = (uint)uVar133 & 0xffff;
                auVar187._4_10_ = auVar74._4_10_;
                auVar187._14_2_ = 0;
                auVar246 = pmaddwd(auVar187,auVar212);
                uVar133 = *(ulong *)((long)pvVar143 + lVar141);
                uVar146 = *(ulong *)((long)pvVar152 + lVar141);
                uVar167 = (undefined2)(uVar146 >> 0x30);
                auVar235._8_4_ = 0;
                auVar235._0_8_ = uVar146;
                auVar235._12_2_ = uVar167;
                auVar235._14_2_ = uVar167;
                uVar167 = (undefined2)(uVar146 >> 0x20);
                auVar234._12_4_ = auVar235._12_4_;
                auVar234._8_2_ = 0;
                auVar234._0_8_ = uVar146;
                auVar234._10_2_ = uVar167;
                auVar233._10_6_ = auVar234._10_6_;
                auVar233._8_2_ = uVar167;
                auVar233._0_8_ = uVar146;
                uVar167 = (undefined2)(uVar146 >> 0x10);
                auVar232._8_8_ = auVar233._8_8_;
                auVar232._6_2_ = uVar167;
                auVar232._4_2_ = uVar167;
                auVar232._0_2_ = (undefined2)uVar146;
                auVar232._2_2_ = auVar232._0_2_;
                auVar54._8_4_ = 0;
                auVar54._0_8_ = uVar133;
                auVar54._12_2_ = (short)(uVar133 >> 0x30);
                auVar62._8_2_ = (short)(uVar133 >> 0x20);
                auVar62._0_8_ = uVar133;
                auVar62._10_4_ = auVar54._10_4_;
                auVar109._6_8_ = 0;
                auVar109._0_6_ = auVar62._8_6_;
                auVar216._6_8_ = SUB148(auVar109 << 0x40,6);
                auVar216._4_2_ = (short)(uVar133 >> 0x10);
                auVar216._0_2_ = (ushort)uVar133;
                auVar216._2_2_ = 0;
                auVar216._14_2_ = 0;
                auVar226 = pmaddwd(auVar216,auVar232);
                uVar133 = *(ulong *)((long)pvVar127 + lVar141);
                uVar146 = *(ulong *)((long)pvVar138 + lVar141);
                uVar167 = (undefined2)(uVar146 >> 0x30);
                auVar239._8_4_ = 0;
                auVar239._0_8_ = uVar146;
                auVar239._12_2_ = uVar167;
                auVar239._14_2_ = uVar167;
                uVar167 = (undefined2)(uVar146 >> 0x20);
                auVar238._12_4_ = auVar239._12_4_;
                auVar238._8_2_ = 0;
                auVar238._0_8_ = uVar146;
                auVar238._10_2_ = uVar167;
                auVar237._10_6_ = auVar238._10_6_;
                auVar237._8_2_ = uVar167;
                auVar237._0_8_ = uVar146;
                uVar167 = (undefined2)(uVar146 >> 0x10);
                auVar236._8_8_ = auVar237._8_8_;
                auVar236._6_2_ = uVar167;
                auVar236._4_2_ = uVar167;
                auVar236._0_2_ = (undefined2)uVar146;
                auVar236._2_2_ = auVar236._0_2_;
                auVar55._8_4_ = 0;
                auVar55._0_8_ = uVar133;
                auVar55._12_2_ = (short)(uVar133 >> 0x30);
                auVar63._8_2_ = (short)(uVar133 >> 0x20);
                auVar63._0_8_ = uVar133;
                auVar63._10_4_ = auVar55._10_4_;
                auVar110._6_8_ = 0;
                auVar110._0_6_ = auVar63._8_6_;
                auVar188._6_8_ = SUB148(auVar110 << 0x40,6);
                auVar188._4_2_ = (short)(uVar133 >> 0x10);
                auVar188._0_2_ = (ushort)uVar133;
                auVar188._2_2_ = 0;
                auVar188._14_2_ = 0;
                auVar202 = pmaddwd(auVar188,auVar236);
                *(int *)(d1 + lVar141) =
                     auVar202._0_4_ + auVar226._0_4_ + auVar246._0_4_ +
                     auVar172._0_4_ + *(int *)(d1 + lVar141);
                *(int *)(d1 + lVar141 + 2) =
                     auVar202._4_4_ + auVar226._4_4_ + auVar246._4_4_ +
                     auVar172._4_4_ + *(int *)(d1 + lVar141 + 2);
                *(int *)((long)aiStack_360 + lVar141 * 2) =
                     auVar202._8_4_ + auVar226._8_4_ + auVar246._8_4_ + auVar172._8_4_ + iVar155;
                *(int *)((long)aiStack_360 + lVar141 * 2 + 4) =
                     auVar202._12_4_ + auVar226._12_4_ + auVar246._12_4_ + auVar172._12_4_ + iVar128
                ;
                lVar141 = lVar141 + 8;
              } while (lVar141 != 0x20);
              uVar133 = uVar137 + 4;
              lVar141 = uVar137 + 7;
              pvVar125 = (void *)((long)pvVar125 + lVar122);
              pvVar149 = (void *)((long)pvVar149 + lVar134);
              pvVar130 = (void *)((long)pvVar130 + lVar122);
              pvVar144 = (void *)((long)pvVar144 + lVar134);
              pvVar143 = (void *)((long)pvVar143 + lVar122);
              pvVar152 = (void *)((long)pvVar152 + lVar134);
              pvVar127 = (void *)((long)pvVar127 + lVar122);
              pvVar138 = (void *)((long)pvVar138 + lVar134);
              uVar137 = uVar133;
            } while (lVar141 < (int)_c);
          }
          if ((int)uVar133 < (int)_c) {
            uVar133 = uVar133 & 0xffffffff;
            lVar141 = (long)local_208.data + local_208.w * local_3c8 + lVar123 * uVar133;
            pvVar125 = (void *)((lVar136 * uVar133 + lVar120) * sVar5 + (long)local_3c0);
            do {
              lVar148 = 0;
              do {
                uVar137 = *(ulong *)(lVar141 + lVar148 * 2);
                uVar146 = *(ulong *)((long)pvVar125 + lVar148 * 2);
                uVar167 = (undefined2)(uVar146 >> 0x30);
                auVar192._8_4_ = 0;
                auVar192._0_8_ = uVar146;
                auVar192._12_2_ = uVar167;
                auVar192._14_2_ = uVar167;
                uVar167 = (undefined2)(uVar146 >> 0x20);
                auVar191._12_4_ = auVar192._12_4_;
                auVar191._8_2_ = 0;
                auVar191._0_8_ = uVar146;
                auVar191._10_2_ = uVar167;
                auVar190._10_6_ = auVar191._10_6_;
                auVar190._8_2_ = uVar167;
                auVar190._0_8_ = uVar146;
                uVar167 = (undefined2)(uVar146 >> 0x10);
                auVar189._8_8_ = auVar190._8_8_;
                auVar189._6_2_ = uVar167;
                auVar189._4_2_ = uVar167;
                auVar189._0_2_ = (undefined2)uVar146;
                auVar189._2_2_ = auVar189._0_2_;
                auVar56._8_4_ = 0;
                auVar56._0_8_ = uVar137;
                auVar56._12_2_ = (short)(uVar137 >> 0x30);
                auVar64._8_2_ = (short)(uVar137 >> 0x20);
                auVar64._0_8_ = uVar137;
                auVar64._10_4_ = auVar56._10_4_;
                auVar111._6_8_ = 0;
                auVar111._0_6_ = auVar64._8_6_;
                auVar166._6_8_ = SUB148(auVar111 << 0x40,6);
                auVar166._4_2_ = (short)(uVar137 >> 0x10);
                auVar166._0_2_ = (ushort)uVar137;
                auVar166._2_2_ = 0;
                auVar166._14_2_ = 0;
                auVar172 = pmaddwd(auVar166,auVar189);
                iVar155 = *(int *)(d1 + lVar148 * 2 + 2);
                iVar128 = aiStack_360[lVar148];
                iVar154 = aiStack_360[lVar148 + 1];
                *(int *)(d1 + lVar148 * 2) = auVar172._0_4_ + *(int *)(d1 + lVar148 * 2);
                *(int *)(d1 + lVar148 * 2 + 2) = auVar172._4_4_ + iVar155;
                aiStack_360[lVar148] = auVar172._8_4_ + iVar128;
                aiStack_360[lVar148 + 1] = auVar172._12_4_ + iVar154;
                lVar148 = lVar148 + 4;
              } while (lVar148 != 0x10);
              uVar133 = uVar133 + 1;
              lVar141 = lVar141 + lVar123;
              pvVar125 = (void *)((long)pvVar125 + sVar5 * lVar136);
            } while (uVar133 != uVar121);
          }
          *(ulong *)((long)d0 + 0x30) = CONCAT44(iStack_334,local_338);
          *(ulong *)((long)d0 + 0x38) = CONCAT44(uStack_32c,iStack_330);
          *(Allocator **)((long)d0 + 0x20) = local_348;
          *(ulong *)((long)d0 + 0x28) = CONCAT44(iStack_33c,iStack_340);
          *(size_t *)((long)d0 + 0x10) = local_358;
          *(ulong *)((long)d0 + 0x18) = CONCAT44(uStack_34c,iStack_350);
          *(short (*) [4])d0 = d1;
          *(ulong *)((long)d0 + 8) = CONCAT44(aiStack_360[1],aiStack_360[0]);
          piVar124 = (int *)((long)piVar124 + 1);
          local_3c8 = local_3c8 + local_208.elemsize;
        } while (piVar124 != local_2b0);
      }
      uVar147 = uVar147 + 1;
      local_2e0 = (void *)((long)local_2e0 + 1);
      local_3d8 = (void *)((long)local_3d8 + lVar129);
      local_3c0 = (void *)((long)local_3c0 + lVar129);
    } while ((long)uVar147 < (long)local_2e8);
  }
  local_328 = 0;
  d1[0] = 0;
  d1[1] = 0;
  d1[2] = 0;
  d1[3] = 0;
  aiStack_360[0] = 0;
  aiStack_360[1] = 0;
  local_358 = 0;
  iStack_350 = 0;
  local_348 = (Allocator *)0x0;
  iStack_340 = 0;
  iStack_33c = 0;
  local_338 = 0;
  iStack_334 = 0;
  iStack_330 = 0;
  piVar124 = (int *)CONCAT44(local_208.refcount._4_4_,(int)local_208.refcount);
  if (piVar124 != (int *)0x0) {
    LOCK();
    *piVar124 = *piVar124 + -1;
    UNLOCK();
    if (*piVar124 == 0) {
      if (local_208.allocator == (Allocator *)0x0) {
        if (local_208.data != (void *)0x0) {
          free(local_208.data);
        }
      }
      else {
        (*(local_208.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar124 = (int *)CONCAT44(aiStack_360[1],aiStack_360[0]);
  local_208.data = (void *)d1;
  local_208.refcount._0_4_ = aiStack_360[0];
  local_208.refcount._4_4_ = aiStack_360[1];
  local_208.elemsize = local_358;
  local_208.elempack = iStack_350;
  local_208.allocator = local_348;
  local_208.d = iStack_334;
  local_208.h = local_338;
  local_208.dims = iStack_340;
  local_208.w = iStack_33c;
  local_208.c = iStack_330;
  local_208.cstep = local_328;
  if (piVar124 != (int *)0x0) {
    LOCK();
    *piVar124 = *piVar124 + -1;
    UNLOCK();
    if (*piVar124 == 0) {
      if (local_348 == (Allocator *)0x0) {
        if (d1 != (short  [4])0x0) {
          free((void *)d1);
        }
      }
      else {
        (*local_348->_vptr_Allocator[3])();
      }
    }
  }
  local_328 = 0;
  d1[0] = 0;
  d1[1] = 0;
  d1[2] = 0;
  d1[3] = 0;
  aiStack_360[0] = 0;
  aiStack_360[1] = 0;
  local_358 = 0;
  iStack_350 = 0;
  local_348 = (Allocator *)0x0;
  iStack_340 = 0;
  iStack_33c = 0;
  local_338 = 0;
  iStack_334 = 0;
  iStack_330 = 0;
  Mat::create((Mat *)d1,(int)local_168,_h,iVar153,4,pOVar117->workspace_allocator);
  if (0 < iVar153) {
    uVar147 = 1;
    if (1 < (int)uVar145) {
      uVar147 = (ulong)uVar145;
    }
    uVar121 = 1;
    if (1 < (int)uVar150) {
      uVar121 = (ulong)uVar150;
    }
    local_3b0[0] = d1[0];
    local_3b0[1] = d1[1];
    local_3b0[2] = d1[2];
    local_3b0[3] = d1[3];
    local_2b0 = (int *)((long)d0 + 0x30);
    uVar133 = 0;
    do {
      if (0 < iVar4) {
        lVar120 = local_358 * (long)iStack_33c + (long)local_3b0;
        lVar129 = (long)iStack_33c * local_358 * 2;
        uVar137 = 0;
        asVar131 = local_3b0;
        do {
          if (0 < iVar3) {
            uVar146 = 0;
            do {
              iVar153 = *(int *)((long)d0 + 4) + *(int *)((long)d0 + 0x14) +
                        *(int *)((long)d0 + 0x24);
              iVar154 = *(int *)((long)d0 + 8) + *(int *)((long)d0 + 0x18) +
                        *(int *)((long)d0 + 0x28);
              iVar155 = *(int *)((long)d0 + 0xc) + *(int *)((long)d0 + 0x1c) +
                        *(int *)((long)d0 + 0x2c);
              iVar168 = (*(int *)((long)d0 + 0x14) - *(int *)((long)d0 + 0x24)) +
                        *(int *)((long)d0 + 0x34);
              iVar169 = (*(int *)((long)d0 + 0x18) - *(int *)((long)d0 + 0x28)) +
                        *(int *)((long)d0 + 0x38);
              local_13c = (*(int *)((long)d0 + 0x1c) - *(int *)((long)d0 + 0x2c)) +
                          *(int *)((long)d0 + 0x3c);
              sum3[0] = iVar155;
              iVar128 = *(int *)d0 + *(int *)((long)d0 + 0x10) + *(int *)((long)d0 + 0x20) + iVar153
                        + iVar154;
              iVar155 = (iVar153 - iVar154) + iVar155;
              iVar153 = (*(int *)((long)d0 + 0x10) - *(int *)((long)d0 + 0x20)) + *local_2b0 +
                        iVar168 + iVar169;
              d2._4_4_ = iVar153;
              d2._0_4_ = iVar128;
              iVar154 = (iVar168 - iVar169) + local_13c;
              d3._4_4_ = iVar154;
              d3._0_4_ = iVar155;
              *(ulong *)((long)asVar131 + uVar146 * 8) = CONCAT44(iVar153 >> 2,iVar128 >> 2);
              *(ulong *)(lVar120 + uVar146 * 8) = CONCAT44(iVar154 >> 2,iVar155 >> 2);
              uVar146 = uVar146 + 1;
            } while (uVar147 != uVar146);
          }
          uVar137 = uVar137 + 1;
          lVar120 = lVar120 + lVar129;
          asVar131 = (short  [4])((long)asVar131 + lVar129);
        } while (uVar137 != uVar121);
      }
      uVar133 = uVar133 + 1;
      local_3b0 = (short  [4])((long)local_3b0 + local_328 * local_358);
    } while (uVar133 != local_2e8);
  }
  copy_cut_border((Mat *)d1,local_170,0,local_338 - local_170->h,0,iStack_33c - local_170->w,
                  local_318);
  piVar124 = (int *)CONCAT44(aiStack_360[1],aiStack_360[0]);
  if (piVar124 != (int *)0x0) {
    LOCK();
    *piVar124 = *piVar124 + -1;
    UNLOCK();
    if (*piVar124 == 0) {
      if (local_348 == (Allocator *)0x0) {
        if (d1 != (short  [4])0x0) {
          free((void *)d1);
        }
      }
      else {
        (*local_348->_vptr_Allocator[3])();
      }
    }
  }
  piVar124 = (int *)CONCAT44(local_208.refcount._4_4_,(int)local_208.refcount);
  if (piVar124 != (int *)0x0) {
    LOCK();
    *piVar124 = *piVar124 + -1;
    UNLOCK();
    if (*piVar124 == 0) {
      if (local_208.allocator == (Allocator *)0x0) {
        if ((short  [4])local_208.data != (short  [4])0x0) {
          free(local_208.data);
        }
      }
      else {
        (*(local_208.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_1b8.refcount != (int *)0x0) {
    LOCK();
    *local_1b8.refcount = *local_1b8.refcount + -1;
    UNLOCK();
    if (*local_1b8.refcount == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if ((short  [4])local_1b8.data != (short  [4])0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4 * 4, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 2;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[4], d1[4], d2[4], d3[4];
                    short w0[4], w1[4], w2[4], w3[4];
                    short t0[4], t1[4], t2[4], t3[4];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0] = w0[0];
                        t1[0] = w0[1];
                        t2[0] = w0[2];
                        t3[0] = w0[3];
                        t0[1] = w1[0];
                        t1[1] = w1[1];
                        t2[1] = w1[2];
                        t3[1] = w1[3];
                        t0[2] = w2[0];
                        t1[2] = w2[1];
                        t2[2] = w2[2];
                        t3[2] = w2[3];
                        t0[3] = w3[0];
                        t1[3] = w3[1];
                        t2[3] = w3[2];
                        t3[3] = w3[3];
                    }
                    // U = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n] = d0[n];
                        out_tm0[n + 4] = d1[n];
                        out_tm0[n + 8] = d2[n];
                        out_tm0[n + 12] = d3[n];
                    }

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        const int tiles = nColBlocks * nRowBlocks;

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p + 1);
            Mat out2_tm = top_blob_tm.channel(p + 2);
            Mat out3_tm = top_blob_tm.channel(p + 3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p + 1);
            const Mat kernel2_tm = kernel_tm.channel(p + 2);
            const Mat kernel3_tm = kernel_tm.channel(p + 3);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);
                int* output1_tm = out1_tm.row<int>(i);
                int* output2_tm = out2_tm.row<int>(i);
                int* output3_tm = out3_tm.row<int>(i);

                int sum0[16] = {0};
                int sum1[16] = {0};
                int sum2[16] = {0};
                int sum3[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += (int)r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += (int)r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += (int)r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum1[n] += (int)r0[n] * k1[n];
                        sum2[n] += (int)r0[n] * k2[n];
                        sum3[n] += (int)r0[n] * k3[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i = 0; i < tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[16] = {0};

                int q = 0;
                for (; q + 3 < inch; q += 4)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q + 1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q + 2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q + 3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel0_tm.row<short>(q + 1);
                    const short* k2 = kernel0_tm.row<short>(q + 2);
                    const short* k3 = kernel0_tm.row<short>(q + 3);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum0[n] += (int)r1[n] * k1[n];
                        sum0[n] += (int)r2[n] * k2[n];
                        sum0[n] += (int)r3[n] * k3[n];
                    }
                }

                for (; q < inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n = 0; n < 16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }
                }

                for (int n = 0; n < 16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // };

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm / 4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm / 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j = 0; j < nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j * 2);
                int* outRow1 = out.row<int>(j * 2 + 1);

                for (int i = 0; i < nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j * nRowBlocks + i);

                    int s0[4], s1[4], s2[4], s3[4];
                    int w0[4], w1[4];
                    int d0[2], d1[2], d2[2], d3[2];
                    int o0[2], o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n + 4];
                        s2[n] = out_tile[n + 8];
                        s3[n] = out_tile[n + 12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0];
                        d0[1] = w1[0];
                        d1[0] = w0[1];
                        d1[1] = w1[1];
                        d2[0] = w0[2];
                        d2[1] = w1[2];
                        d3[0] = w0[3];
                        d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n];
                        o1[n] = d1[n] - d2[n] + d3[n];
                    }
                    // save to top blob tm,why right 2,because the G' = G*2
                    outRow0[0] = o0[0] >> 2;
                    outRow0[1] = o0[1] >> 2;
                    outRow1[0] = o1[0] >> 2;
                    outRow1[1] = o1[1] >> 2;

                    outRow0 += 2;
                    outRow1 += 2;
                }
            }
        }
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}